

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllocationInstruction.h
# Opt level: O2

MsgType * FIX44::AllocationInstruction::MsgType(void)

{
  MsgType *in_RDI;
  allocator<char> local_31;
  STRING local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"J",&local_31);
  FIX::MsgType::MsgType(in_RDI,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

static FIX::MsgType MsgType() { return FIX::MsgType("J"); }